

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layer_switch_Dyy_unconditional(response_layer *layer,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  float *data_1;
  float *pfVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  bool *pbVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  float *pfVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  long lVar50;
  int iVar51;
  int iVar52;
  long lVar53;
  uint uVar54;
  int iVar55;
  float *data;
  undefined1 auVar56 [16];
  float fVar57;
  float local_1a8 [12];
  integral_image *local_178;
  float *local_168;
  bool *local_160;
  ulong local_138;
  ulong local_128;
  long local_e8;
  ulong local_c8;
  float *local_80;
  long local_58;
  
  iVar7 = iimage->height;
  iVar2 = layer->filter_size;
  if (iVar2 <= iVar7) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer,iimage);
    return;
  }
  uVar18 = iimage->width;
  uVar11 = iVar2 / 3;
  uVar33 = (iVar2 + -1) - (iVar2 + -1 >> 0x1f) >> 1;
  local_c8 = (ulong)uVar33;
  local_128 = (ulong)uVar11;
  if (iVar7 <= (int)uVar33) {
    iVar55 = layer->height;
    iVar6 = iimage->data_width;
    lVar35 = (long)iVar6;
    pfVar15 = iimage->data;
    iVar13 = layer->step;
    lVar50 = (long)iVar13;
    local_168 = layer->response;
    fVar57 = 1.0 / (float)(iVar2 * iVar2);
    local_160 = layer->laplacian;
    if ((int)uVar11 < (int)uVar18) {
      lVar35 = -0x1a8 - ((ulong)uVar18 * 4 + 0xf & 0xfffffffffffffff0);
      iVar39 = layer->width * iVar13;
      iVar6 = (iVar7 + -1) * iVar6;
      local_e8 = lVar50;
      if (iVar39 - uVar11 == 0 || iVar39 < (int)uVar11) {
        lVar14 = 0;
      }
      else {
        lVar14 = 0;
        do {
          *(float *)((long)local_1a8 + lVar14 * 4 + lVar35 + 0x1a8) =
               pfVar15[(int)((uVar11 - 1) + iVar6 + (int)lVar14)];
          lVar14 = lVar14 + lVar50;
        } while (lVar14 < (long)(ulong)(iVar39 - uVar11));
      }
      fVar1 = pfVar15[(int)((uVar18 - 1) + iVar6)];
      if ((int)lVar14 < (int)uVar11) {
        lVar14 = (long)(int)lVar14;
        do {
          *(float *)((long)local_1a8 + lVar14 * 4 + lVar35 + 0x1a8) = fVar1;
          lVar14 = lVar14 + lVar50;
        } while (lVar14 < (int)uVar11);
      }
      iVar7 = (int)lVar14;
      local_178 = iimage;
      if (iVar7 < iVar39) {
        lVar14 = (long)iVar7;
        iVar7 = (iVar6 + iVar7) - uVar11;
        do {
          lVar8 = (long)iVar7;
          iVar7 = iVar7 + iVar13;
          *(float *)((long)local_1a8 + lVar14 * 4 + lVar35 + 0x1a8) = fVar1 - pfVar15[lVar8];
          lVar14 = lVar14 + lVar50;
        } while (lVar14 < iVar39);
      }
      iVar55 = iVar55 * iVar13;
      if (0 < iVar55) {
        local_c8._0_4_ = ~(uint)local_c8;
        iVar49 = -1;
        iVar48 = 0;
        uVar33 = (uint)local_128;
        uVar16 = ~uVar33;
        iVar37 = -uVar33;
        iVar13 = uVar33 - 1;
        iVar52 = 0;
        iVar31 = iVar13 - iVar2 / 6;
        uVar10 = ~(iVar2 / 6);
        local_138 = local_128 & 0xffffffff;
        iVar6 = iVar13;
        uVar18 = uVar10;
        uVar11 = uVar16;
        iVar7 = iVar31;
        do {
          if (0 < iVar39) {
            iVar45 = local_178->data_width;
            pfVar9 = local_178->data;
            iVar46 = iVar45 * (int)local_138;
            iVar41 = iVar45 * iVar52;
            pfVar15 = local_168 + iVar48;
            pbVar32 = local_160 + iVar48;
            iVar51 = iVar45 * iVar49;
            iVar42 = iVar45 * uVar11;
            iVar17 = iVar45 * iVar6;
            iVar34 = iVar45 * iVar37;
            lVar50 = 0;
            do {
              iVar20 = (int)lVar50;
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)((pfVar9[iVar31 + iVar17 + iVar20] -
                                                       pfVar9[iVar31 + iVar34 + iVar20]) +
                                                      (pfVar9[(int)(uVar10 + iVar34 + iVar20)] -
                                                      pfVar9[(int)(uVar10 + iVar17 + iVar20)]))),
                                        SUB6416(ZEXT464(0xc0400000),0),
                                        ZEXT416((uint)((pfVar9[(int)(iVar34 + (uint)local_c8 +
                                                                    iVar20)] -
                                                       pfVar9[(int)(iVar17 + (uint)local_c8 + iVar20
                                                                   )]) +
                                                      (pfVar9[(int)((uint)local_c8 + iVar2 + iVar17
                                                                   + iVar20)] -
                                                      pfVar9[(int)((uint)local_c8 + iVar2 + iVar34 +
                                                                  iVar20)]))));
              fVar1 = fVar57 * auVar56._0_4_;
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)((pfVar9[((int)(iVar45 * uVar18) + lVar50) -
                                                               (long)(int)uVar33] -
                                                       pfVar9[(iVar45 * iVar7 + lVar50) -
                                                              (long)(int)uVar33]) +
                                                      (pfVar9[iVar45 * iVar7 + iVar13 + iVar20] -
                                                      pfVar9[(int)(iVar45 * uVar18 + iVar13 + iVar20
                                                                  )]))),
                                        SUB6416(ZEXT464(0xc0400000),0),
                                        ZEXT416(*(uint *)((long)local_1a8 +
                                                         lVar50 * 4 + lVar35 + 0x1a8)));
              fVar4 = fVar57 * auVar56._0_4_;
              fVar5 = fVar57 * ((((pfVar9[(int)(uVar33 + iVar51 + iVar20)] -
                                  pfVar9[(int)(uVar33 + iVar42 + iVar20)]) +
                                  (pfVar9[iVar42 + lVar50] - pfVar9[iVar51 + lVar50]) +
                                 (pfVar9[(int)(uVar16 + iVar41 + iVar20)] -
                                 pfVar9[(int)(uVar16 + iVar46 + iVar20)]) +
                                 (pfVar9[iVar46 + -1 + iVar20] - pfVar9[iVar41 + -1 + iVar20])) -
                                ((pfVar9[(int)(uVar16 + iVar42 + iVar20)] -
                                 pfVar9[(int)(uVar16 + iVar51 + iVar20)]) +
                                (pfVar9[iVar51 + -1 + iVar20] - pfVar9[iVar42 + -1 + iVar20]))) -
                               ((pfVar9[(int)(uVar33 + iVar46 + iVar20)] -
                                pfVar9[(int)(uVar33 + iVar41 + iVar20)]) +
                               (pfVar9[iVar41 + lVar50] - pfVar9[iVar46 + lVar50])));
              auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5 * -0.81)),ZEXT416((uint)fVar1),
                                        ZEXT416((uint)fVar4));
              *pfVar15 = auVar56._0_4_;
              *pbVar32 = 0.0 <= fVar4 + fVar1;
              lVar50 = lVar50 + local_e8;
              pfVar15 = pfVar15 + 1;
              pbVar32 = pbVar32 + 1;
              iVar48 = iVar48 + 1;
            } while (lVar50 < iVar39);
          }
          iVar45 = (int)local_e8;
          local_138 = (ulong)(uint)((int)local_138 + iVar45);
          iVar7 = iVar7 + iVar45;
          iVar52 = iVar52 + iVar45;
          iVar49 = iVar49 + iVar45;
          uVar11 = uVar11 + iVar45;
          uVar18 = uVar18 + iVar45;
          iVar6 = iVar6 + iVar45;
          iVar37 = iVar37 + iVar45;
        } while (iVar52 < iVar55);
      }
    }
    else {
      iVar39 = layer->width * iVar13;
      lVar14 = (long)iVar39;
      lVar8 = (long)(int)uVar11;
      fVar1 = pfVar15[(int)((iVar7 + -1) * iVar6 + -1 + uVar18)];
      uVar16 = ~uVar33;
      uVar10 = iVar2 / 6;
      uVar54 = ~uVar10;
      if (iVar39 - uVar10 == 0 || iVar39 < (int)uVar10) {
        iVar7 = 0;
        lVar53 = 0;
      }
      else {
        iVar37 = iVar6 * uVar11;
        iVar48 = -iVar6;
        iVar51 = ~uVar11 * iVar6;
        iVar41 = iVar13 * iVar6;
        iVar20 = iVar48 - uVar11;
        iVar31 = (iVar6 + -1) * uVar11;
        iVar17 = (uVar11 - 1) * iVar6;
        iVar36 = iVar51 - uVar11;
        iVar42 = (iVar6 + 1) * uVar11;
        iVar46 = uVar11 - iVar6;
        iVar49 = iVar17 - uVar10;
        iVar52 = iVar2 + uVar16 + iVar17;
        iVar45 = uVar11 + uVar54 + iVar17;
        iVar17 = iVar17 - uVar33;
        lVar53 = 0;
        iVar34 = uVar11 + iVar51;
        iVar7 = 0;
        local_80 = pfVar15;
        do {
          auVar56 = vfmadd213ss_fma(ZEXT416((uint)pfVar15[(int)((uVar11 + uVar54 + (int)lVar53) *
                                                                iVar6 + (uVar18 - 1))]),
                                    SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar1));
          if (0 < iVar39) {
            lVar19 = lVar53 * lVar35;
            fVar4 = fVar57 * auVar56._0_4_;
            iVar47 = -1;
            lVar38 = 0;
            lVar12 = (lVar53 - lVar8) * lVar35;
            pfVar9 = local_168 + iVar7;
            pbVar32 = local_160 + iVar7;
            do {
              iVar21 = iVar34 + 1 + iVar47;
              iVar40 = iVar46 + 1 + iVar47;
              lVar43 = (long)iVar47;
              auVar56 = vfmadd132ss_fma(ZEXT416((uint)((pfVar15[lVar12 + (int)(iVar47 - uVar10)] -
                                                       pfVar15[iVar49 + iVar47]) +
                                                      (pfVar15[iVar45 + 1 + iVar47] -
                                                      pfVar15[lVar12 + (int)((uVar11 - uVar10) +
                                                                            iVar47)]))),
                                        ZEXT416((uint)((pfVar15[lVar12 + (int)(iVar47 - uVar33)] -
                                                       pfVar15[iVar17 + iVar47]) +
                                                      (pfVar15[iVar52 + 1 + iVar47] -
                                                      pfVar15[lVar12 + (int)((iVar2 - uVar33) +
                                                                            iVar47)]))),
                                        SUB6416(ZEXT464(0xc0400000),0));
              iVar22 = iVar47 - uVar11;
              fVar5 = fVar57 * auVar56._0_4_;
              iVar23 = iVar37 + iVar47;
              iVar24 = iVar31 + iVar47;
              iVar25 = iVar36 + iVar47;
              iVar26 = iVar48 + iVar47;
              iVar27 = iVar20 + iVar47;
              iVar28 = iVar51 + iVar47;
              iVar29 = iVar42 + 1 + iVar47;
              iVar30 = uVar11 + 1 + iVar47;
              iVar47 = iVar47 + iVar13;
              fVar3 = fVar57 * ((((pfVar15[lVar19 + iVar22] - pfVar15[iVar24]) +
                                  (pfVar15[iVar23] - pfVar15[lVar19 + lVar43]) +
                                 (pfVar15[iVar40] - pfVar15[iVar21]) +
                                 (pfVar15[iVar51 + lVar38] - pfVar15[iVar48 + lVar38])) -
                                ((pfVar15[iVar25] - pfVar15[iVar27]) +
                                (pfVar15[iVar26] - pfVar15[iVar28]))) -
                               ((local_80[lVar38] - pfVar15[iVar37 + lVar38]) +
                               (pfVar15[iVar29] - pfVar15[lVar19 + iVar30])));
              auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * -0.81 * fVar3)),ZEXT416((uint)fVar5),
                                        ZEXT416((uint)fVar4));
              *pfVar9 = auVar56._0_4_;
              *pbVar32 = 0.0 <= fVar4 + fVar5;
              lVar38 = lVar38 + lVar50;
              pfVar9 = pfVar9 + 1;
              pbVar32 = pbVar32 + 1;
              iVar7 = iVar7 + 1;
            } while (lVar38 < lVar14);
          }
          iVar37 = iVar37 + iVar41;
          iVar34 = iVar34 + iVar41;
          lVar53 = lVar53 + lVar50;
          local_80 = local_80 + lVar50 * lVar35;
          iVar48 = iVar48 + iVar41;
          iVar51 = iVar51 + iVar41;
          iVar31 = iVar31 + iVar41;
          iVar20 = iVar20 + iVar41;
          iVar36 = iVar36 + iVar41;
          iVar42 = iVar42 + iVar41;
          iVar46 = iVar46 + iVar41;
          iVar45 = iVar45 + iVar41;
          iVar49 = iVar49 + iVar41;
          iVar52 = iVar52 + iVar41;
          iVar17 = iVar17 + iVar41;
        } while (lVar53 < (long)(ulong)(iVar39 - uVar10));
      }
      fVar1 = fVar1 * -2.0;
      iVar31 = (int)lVar53;
      if (iVar31 <= (int)uVar10) {
        local_58 = (long)iVar31;
        iVar20 = iVar13 * iVar6;
        fVar4 = fVar57 * fVar1;
        iVar41 = (iVar31 + uVar11) * iVar6;
        iVar51 = iVar41 - uVar11;
        iVar36 = (iVar31 + -1 + uVar11) * iVar6;
        pfVar9 = pfVar15 + local_58 * lVar35;
        iVar34 = iVar6 * (iVar31 + -1);
        iVar31 = ((iVar31 + -1) - uVar11) * iVar6;
        iVar37 = uVar54 + uVar11 + iVar36;
        iVar42 = iVar34 - uVar11;
        iVar48 = iVar36 - uVar10;
        iVar46 = iVar31 - uVar11;
        iVar49 = iVar2 + uVar16 + iVar36;
        iVar36 = iVar36 - uVar33;
        iVar52 = iVar41 + uVar11;
        iVar45 = uVar11 + iVar34;
        iVar17 = uVar11 + iVar31;
        do {
          if (0 < iVar39) {
            lVar19 = local_58 * lVar35;
            iVar47 = -1;
            lVar53 = (local_58 - lVar8) * lVar35;
            pfVar44 = local_168 + iVar7;
            pbVar32 = local_160 + iVar7;
            lVar12 = 0;
            do {
              iVar22 = iVar17 + 1 + iVar47;
              iVar40 = iVar45 + 1 + iVar47;
              lVar38 = (long)iVar47;
              iVar23 = iVar47 - uVar11;
              auVar56 = vfmadd132ss_fma(ZEXT416((uint)((pfVar15[lVar53 + (int)(iVar47 - uVar10)] -
                                                       pfVar15[iVar48 + iVar47]) +
                                                      (pfVar15[iVar37 + 1 + iVar47] -
                                                      pfVar15[lVar53 + (int)((uVar11 - uVar10) +
                                                                            iVar47)]))),
                                        ZEXT416((uint)((pfVar15[lVar53 + (int)(iVar47 - uVar33)] -
                                                       pfVar15[iVar36 + iVar47]) +
                                                      (pfVar15[iVar49 + 1 + iVar47] -
                                                      pfVar15[lVar53 + (int)((iVar2 - uVar33) +
                                                                            iVar47)]))),
                                        SUB6416(ZEXT464(0xc0400000),0));
              iVar24 = iVar41 + iVar47;
              fVar5 = fVar57 * auVar56._0_4_;
              iVar25 = iVar51 + iVar47;
              iVar26 = iVar46 + iVar47;
              iVar27 = iVar34 + iVar47;
              iVar28 = iVar42 + iVar47;
              iVar29 = iVar31 + iVar47;
              iVar30 = iVar52 + 1 + iVar47;
              iVar21 = uVar11 + 1 + iVar47;
              iVar47 = iVar47 + iVar13;
              fVar3 = fVar57 * ((((pfVar15[lVar19 + iVar23] - pfVar15[iVar25]) +
                                  (pfVar15[iVar24] - pfVar15[lVar19 + lVar38]) +
                                 (pfVar15[iVar40] - pfVar15[iVar22]) +
                                 (pfVar15[iVar31 + lVar12] - pfVar15[iVar34 + lVar12])) -
                                ((pfVar15[iVar26] - pfVar15[iVar28]) +
                                (pfVar15[iVar27] - pfVar15[iVar29]))) -
                               ((pfVar9[lVar12] - pfVar15[iVar41 + lVar12]) +
                               (pfVar15[iVar30] - pfVar15[lVar19 + iVar21])));
              auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * -0.81 * fVar3)),ZEXT416((uint)fVar5),
                                        ZEXT416((uint)fVar4));
              *pfVar44 = auVar56._0_4_;
              *pbVar32 = 0.0 <= fVar4 + fVar5;
              lVar12 = lVar12 + lVar50;
              pfVar44 = pfVar44 + 1;
              pbVar32 = pbVar32 + 1;
              iVar7 = iVar7 + 1;
            } while (lVar12 < lVar14);
          }
          iVar41 = iVar41 + iVar20;
          iVar52 = iVar52 + iVar20;
          iVar45 = iVar45 + iVar20;
          local_58 = local_58 + lVar50;
          pfVar9 = pfVar9 + lVar50 * lVar35;
          iVar34 = iVar34 + iVar20;
          iVar31 = iVar31 + iVar20;
          iVar51 = iVar51 + iVar20;
          iVar42 = iVar42 + iVar20;
          iVar46 = iVar46 + iVar20;
          iVar17 = iVar17 + iVar20;
          iVar48 = iVar48 + iVar20;
          iVar37 = iVar37 + iVar20;
          iVar49 = iVar49 + iVar20;
          iVar36 = iVar36 + iVar20;
        } while (local_58 <= (int)uVar10);
        iVar31 = (int)local_58;
      }
      iVar55 = iVar55 * iVar13;
      if (iVar31 < iVar55) {
        lVar53 = (long)iVar31;
        iVar46 = iVar13 * iVar6;
        iVar49 = iVar6 * (iVar31 + -1);
        pfVar9 = pfVar15 + lVar53 * lVar35;
        iVar48 = iVar49 - uVar11;
        iVar36 = ((iVar31 + -1) - uVar11) * iVar6;
        iVar20 = (iVar31 + uVar11) * iVar6;
        iVar37 = iVar20 - uVar11;
        iVar52 = iVar36 - uVar11;
        iVar17 = (iVar31 + -1 + uVar11) * iVar6;
        iVar45 = iVar17 - uVar10;
        iVar51 = uVar11 + iVar17 + uVar54;
        iVar31 = uVar16 + iVar2 + iVar17;
        iVar17 = iVar17 - uVar33;
        iVar34 = uVar11 + iVar20;
        iVar41 = uVar11 + iVar49;
        iVar42 = uVar11 + iVar36;
        do {
          auVar56 = vfmadd213ss_fma(ZEXT416((uint)pfVar15[(int)((uVar54 + (int)lVar53) * iVar6 +
                                                               (uVar18 - 1))]),
                                    SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar1));
          if (0 < iVar39) {
            fVar4 = fVar57 * auVar56._0_4_;
            lVar19 = 0;
            lVar38 = lVar53 * lVar35;
            lVar12 = (lVar53 - lVar8) * lVar35;
            pfVar44 = local_168 + iVar7;
            pbVar32 = local_160 + iVar7;
            iVar47 = -1;
            do {
              iVar21 = iVar42 + 1 + iVar47;
              iVar23 = iVar41 + 1 + iVar47;
              iVar22 = iVar47 - uVar11;
              lVar43 = (long)iVar47;
              iVar24 = iVar20 + iVar47;
              auVar56 = vfmadd132ss_fma(ZEXT416((uint)((pfVar15[lVar12 + (int)(iVar47 - uVar10)] -
                                                       pfVar15[iVar45 + iVar47]) +
                                                      (pfVar15[iVar51 + 1 + iVar47] -
                                                      pfVar15[lVar12 + (int)((uVar11 - uVar10) +
                                                                            iVar47)]))),
                                        ZEXT416((uint)((pfVar15[iVar31 + 1 + iVar47] -
                                                       pfVar15[lVar12 + (int)((iVar2 - uVar33) +
                                                                             iVar47)]) +
                                                      (pfVar15[lVar12 + (int)(iVar47 - uVar33)] -
                                                      pfVar15[iVar17 + iVar47]))),
                                        SUB6416(ZEXT464(0xc0400000),0));
              fVar5 = auVar56._0_4_ * fVar57;
              iVar25 = iVar37 + iVar47;
              iVar26 = iVar52 + iVar47;
              iVar27 = iVar49 + iVar47;
              iVar28 = iVar48 + iVar47;
              iVar29 = iVar36 + iVar47;
              auVar56 = vsubss_avx512f(ZEXT416((uint)pfVar15[iVar34 + 1 + iVar47]),
                                       ZEXT416((uint)pfVar15[lVar38 + (int)(uVar11 + 1 + iVar47)]));
              iVar47 = iVar47 + iVar13;
              auVar56 = vaddss_avx512f(ZEXT416((uint)(pfVar9[lVar19] - pfVar15[iVar20 + lVar19])),
                                       auVar56);
              fVar3 = fVar57 * ((((pfVar15[lVar38 + iVar22] - pfVar15[iVar25]) +
                                  (pfVar15[iVar24] - pfVar15[lVar38 + lVar43]) +
                                 (pfVar15[iVar23] - pfVar15[iVar21]) +
                                 (pfVar15[iVar36 + lVar19] - pfVar15[iVar49 + lVar19])) -
                                ((pfVar15[iVar26] - pfVar15[iVar28]) +
                                (pfVar15[iVar27] - pfVar15[iVar29]))) - auVar56._0_4_);
              auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * -0.81 * fVar3)),ZEXT416((uint)fVar5),
                                        ZEXT416((uint)fVar4));
              *pfVar44 = auVar56._0_4_;
              *pbVar32 = 0.0 <= fVar5 + fVar4;
              lVar19 = lVar19 + lVar50;
              pfVar44 = pfVar44 + 1;
              pbVar32 = pbVar32 + 1;
              iVar7 = iVar7 + 1;
            } while (lVar19 < lVar14);
          }
          iVar20 = iVar20 + iVar46;
          iVar52 = iVar52 + iVar46;
          iVar34 = iVar34 + iVar46;
          iVar41 = iVar41 + iVar46;
          lVar53 = lVar53 + lVar50;
          pfVar9 = pfVar9 + lVar50 * lVar35;
          iVar49 = iVar49 + iVar46;
          iVar36 = iVar36 + iVar46;
          iVar37 = iVar37 + iVar46;
          iVar48 = iVar48 + iVar46;
          iVar42 = iVar42 + iVar46;
          iVar45 = iVar45 + iVar46;
          iVar51 = iVar51 + iVar46;
          iVar17 = iVar17 + iVar46;
          iVar31 = iVar31 + iVar46;
        } while (lVar53 < iVar55);
      }
    }
    return;
  }
  if (SBORROW4(uVar18,uVar11 * 2) == (int)(uVar18 + uVar11 * -2) < 0) {
    height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
    return;
  }
  height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function:
        - compute_response_layer_switch_Dyy
        (- compute_response_layer_unconditional)

        optimization:
        - box_integral_unconditional instead of box_integral
            => makes use of padded image and removes all conditionals
        - uses compute_response_layer_Dyy_laplacian_locality_uncond_opt_flops_inlined
            => best function for filter_size <= iheight
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        // 2. Case The filter is somewhat larger than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image. Blue lines edition brings the switch into Dyy
            // Idea: Do compute_response_layer_Dyy_leftcorner
            // but everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO: fix this

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    for (y = 0; y < width*step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {
                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height * step; x += step) {

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}